

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O1

MDD lddmc_follow(MDD mdd,uint32_t value)

{
  uint uVar1;
  uint8_t *puVar2;
  llmsset_t *pplVar3;
  long lVar4;
  llmsset_t *pplVar5;
  
  pplVar3 = &nodes;
  do {
    if (mdd < 2) {
      return mdd;
    }
    puVar2 = nodes->data;
    lVar4 = mdd * 0x10;
    if (((uint)*(ulong *)(puVar2 + lVar4 + 8) >> 0x10 & 1) == 0) {
      pplVar5 = (llmsset_t *)0x0;
      uVar1 = *(uint *)(puVar2 + lVar4 + 6);
      if (value < uVar1) {
        pplVar3 = pplVar5;
      }
      if (uVar1 == value) {
        pplVar3 = (llmsset_t *)(*(ulong *)(puVar2 + lVar4 + 8) >> 0x11);
      }
      if (uVar1 < value) goto LAB_00111a53;
    }
    else {
LAB_00111a53:
      mdd = *(ulong *)(puVar2 + lVar4) >> 1 & 0x7fffffffffff;
      pplVar5 = (llmsset_t *)0x1;
    }
    if ((char)pplVar5 == '\0') {
      return (MDD)pplVar3;
    }
  } while( true );
}

Assistant:

MDD
lddmc_follow(MDD mdd, uint32_t value)
{
    for (;;) {
        if (mdd <= lddmc_true) return mdd;
        const mddnode_t n = LDD_GETNODE(mdd);
        if (!mddnode_getcopy(n)) {
            const uint32_t v = mddnode_getvalue(n);
            if (v == value) return mddnode_getdown(n);
            if (v > value) return lddmc_false;
        }
        mdd = mddnode_getright(n);
    }
}